

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O1

monster_race * select_shape(monster *mon,wchar_t type)

{
  monster_race *pmVar1;
  
  summon_specific_type = type;
  get_mon_num_prep(summon_specific_okay);
  pmVar1 = get_mon_num(player->depth + L'\x05',(int)player->depth);
  get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
  return pmVar1;
}

Assistant:

struct monster_race *select_shape(struct monster *mon, int type)
{
	struct monster_race *race = NULL;

	/* Save the "summon" type */
	summon_specific_type = type;

	/* Prepare allocation table */
	get_mon_num_prep(summon_specific_okay);

	/* Pick a monster */
	race = get_mon_num(player->depth + 5, player->depth);

	/* Prepare allocation table */
	get_mon_num_prep(NULL);

	return race;
}